

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O0

string * EncodeDestination_abi_cxx11_(CTxDestination *dest)

{
  DestinationEncoder *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *__variants;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Params();
  __variants = (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)&stack0xfffffffffffffff0;
  anon_unknown.dwarf_17c577::DestinationEncoder::DestinationEncoder
            ((DestinationEncoder *)in_RDI,(CChainParams *)0x1f44e3);
  std::
  visit_abi_cxx11_<(anonymous_namespace)::DestinationEncoder,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>const&>
            (in_RSI,__variants);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string EncodeDestination(const CTxDestination& dest)
{
    return std::visit(DestinationEncoder(Params()), dest);
}